

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

void __thiscall ON_RenderContentPrivate::SetXMLNode(ON_RenderContentPrivate *this,ON_XMLNode *node)

{
  ON_RenderContent *pOVar1;
  bool bVar2;
  int iVar3;
  ON_XMLNode *pOVar4;
  undefined4 extraout_var;
  wchar_t *component_name;
  ON_XMLVariant local_348;
  ON_UUID local_250;
  ON_XMLVariant local_240;
  undefined1 local_148 [8];
  ON_wString name;
  ON_RenderContent *child_rc;
  ON_wString *name_1;
  ON_XMLNode *child_node;
  ChildIterator it;
  undefined1 local_108 [8];
  ON_XMLNode node_copy;
  lock_guard<std::recursive_mutex> lg;
  ON_XMLNode *node_local;
  ON_RenderContentPrivate *this_local;
  ON_wString *rhs;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)(node_copy._PRIVATE + 0xd0),&this->m_mutex);
  ON_XMLNode::ON_XMLNode((ON_XMLNode *)local_108,node);
  ON_XMLNode::GetChildIterator((ON_XMLNode *)&child_node);
  while (pOVar4 = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)&child_node),
        pOVar4 != (ON_XMLNode *)0x0) {
    iVar3 = (*pOVar4->_vptr_ON_XMLNode[3])();
    rhs = (ON_wString *)CONCAT44(extraout_var,iVar3);
    bVar2 = ::operator==(L"material",rhs);
    if (((bVar2) || (bVar2 = ::operator==(L"environment",rhs), bVar2)) ||
       (bVar2 = ::operator==(L"texture",rhs), bVar2)) {
      name.m_s = (wchar_t *)NewRenderContentFromNode(pOVar4);
      if ((ON_RenderContent *)name.m_s != (ON_RenderContent *)0x0) {
        AddChild(this,(ON_RenderContent *)name.m_s);
      }
      pOVar4 = ON_XMLNode::DetachChild((ON_XMLNode *)local_108,pOVar4);
      if (pOVar4 != (ON_XMLNode *)0x0) {
        (*pOVar4->_vptr_ON_XMLNode[1])();
      }
    }
  }
  ON_XMLNode::operator=(&this->m_node,(ON_XMLNode *)local_108);
  GetPropertyValue(&local_240,this,L"instance-name");
  ::ON_XMLVariant::AsString((ON_XMLVariant *)local_148);
  ::ON_XMLVariant::~ON_XMLVariant(&local_240);
  bVar2 = ON_ModelComponent::IsValidComponentName((ON_wString *)local_148);
  if (!bVar2) {
    EnsureNameValid((ON_wString *)local_148);
  }
  pOVar1 = this->m_render_content;
  component_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_148);
  ON_ModelComponent::SetName(&pOVar1->super_ON_ModelComponent,component_name);
  pOVar1 = this->m_render_content;
  GetPropertyValue(&local_348,this,L"instance-id");
  local_250 = ::ON_XMLVariant::AsUuid(&local_348);
  ON_ModelComponent::SetId(&pOVar1->super_ON_ModelComponent,&local_250);
  ::ON_XMLVariant::~ON_XMLVariant(&local_348);
  ON_wString::~ON_wString((ON_wString *)local_148);
  ON_XMLNode::ChildIterator::~ChildIterator((ChildIterator *)&child_node);
  ON_XMLNode::~ON_XMLNode((ON_XMLNode *)local_108);
  std::lock_guard<std::recursive_mutex>::~lock_guard
            ((lock_guard<std::recursive_mutex> *)(node_copy._PRIVATE + 0xd0));
  return;
}

Assistant:

void ON_RenderContentPrivate::SetXMLNode(const ON_XMLNode& node)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  // Copy the incoming XML node. The render content will only store a copy of its own XML, so
  // we will have to prune this copy as we find children and create render content children
  // for all the XML children.
  ON_XMLNode node_copy = node;

  // Iterate over the child nodes of the XML node being set to this content.
  auto it = node_copy.GetChildIterator();
  ON_XMLNode* child_node = nullptr;
  while (nullptr != (child_node = it.GetNextChild()))
  {
    // See if the child node is a content node.
    const ON_wString& name = child_node->TagName();
    if ((ON_KIND_MATERIAL == name) || (ON_KIND_ENVIRONMENT == name) || (ON_KIND_TEXTURE == name))
    {
      // Yes, so we are going to add a new render content to this hierarchy (recursively)
      // and remove this child node from the copy of the XML node.
      ON_RenderContent* child_rc = NewRenderContentFromNode(*child_node);
      if (nullptr != child_rc)
      {
        // Add the new content as a child of this content.
        AddChild(*child_rc);
      }

      delete node_copy.DetachChild(*child_node);
    }
  }

  // Copy the pruned copy of the XML node. This node does not have any child content nodes.
  m_node = node_copy;

  // Copy the XML instance name to the component name after validating it.
  ON_wString name = GetPropertyValue(ON_RENDER_CONTENT_INSTANCE_NAME).AsString();

  // 29th November 2023 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-78603
  if (!ON_ModelComponent::IsValidComponentName(name))
  {
    EnsureNameValid(name);
  }

  m_render_content.SetName(name);

  // Copy the XML instance id to the component id.
  m_render_content.SetId(GetPropertyValue(ON_RENDER_CONTENT_INSTANCE_ID).AsUuid());
}